

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

float smach(int job)

{
  float fVar1;
  float extraout_XMM0_Da;
  float fVar2;
  float fVar3;
  string local_38;
  allocator<char> local_11;
  
  fVar3 = 1.0;
  do {
    fVar1 = fVar3;
    fVar3 = fVar1 * 0.5;
  } while (1.0 < fVar1 * 0.5 + 1.0);
  fVar3 = 1.0;
  do {
    do {
      fVar2 = fVar3;
      fVar3 = fVar2 * 0.0625;
    } while (fVar3 != 0.0);
  } while (NAN(fVar3));
  if (job != 1) {
    fVar1 = (fVar2 / fVar1) * 100.0;
    if (job != 3) {
      if (job == 2) {
        return fVar1;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SMACH",&local_11);
      xerbla(&local_38,1);
      fVar1 = extraout_XMM0_Da;
    }
    fVar1 = 1.0 / fVar1;
  }
  return fVar1;
}

Assistant:

float smach ( int job )

//****************************************************************************80
//
//  Purpose:
//
//    SMACH computes machine parameters of float arithmetic.
//
//  Discussion:
//
//    This routine is for testing only.  It is not required by LINPACK.
//
//    If there is trouble with the automatic computation of these quantities,
//    they can be set by direct assignment statements.
//
//    We assume the computer has
//
//      B = base of arithmetic;
//      T = number of base B digits;
//      L = smallest possible exponent;
//      U = largest possible exponent.
//
//    then
//
//      EPS = B**(1-T)
//      TINY = 100.0 * B**(-L+T)
//      HUGE = 0.01 * B**(U-T)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int JOB:
//    1: requests EPS;
//    2: requests TINY;
//    3: requests HUGE.
//
//    Output, float SMACH, the requested value.
//
{
  float eps;
  float huge;
  float s;
  float tiny;
  float value;

  eps = 1.0;
  for ( ; ; )
  {
    value = 1.0 + ( eps / 2.0 );
    if ( value <= 1.0 )
    {
      break;
    }
    eps = eps / 2.0;
  }

  s = 1.0;

  for ( ; ; )
  {
    tiny = s;
    s = s / 16.0;

    if ( s * 1.0 == 0.0 )
    {
      break;
    }

  }

  tiny = ( tiny / eps ) * 100.0;
  huge = 1.0 / tiny;

  if ( job == 1 )
  {
    value = eps;
  }
  else if ( job == 2 )
  {
    value = tiny;
  }
  else if ( job == 3 )
  {
    value = huge;
  }
  else
  {
    xerbla ( "SMACH", 1 );
  }

  return value;
}